

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfIO.cpp
# Opt level: O2

void __thiscall Imf_3_4::IStream::~IStream(IStream *this)

{
  code *pcVar1;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

IStream::~IStream ()
{
    // empty
}